

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5CInstIterNext(CInstIter *pIter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  int io;
  int ic;
  int ip;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->iStart = -1;
  pIter->iEnd = -1;
  iVar1 = 0;
  do {
    do {
      iVar4 = iVar1;
      if ((iVar4 != 0) || (pIter->nInst <= pIter->iInst)) goto LAB_001d4a3d;
      local_3c = -0x55555556;
      local_40 = -0x55555556;
      local_44 = -0x55555556;
      iVar1 = (*pIter->pApi->xInst)(pIter->pFts,pIter->iInst,&local_3c,&local_40,&local_44);
      iVar3 = local_44;
    } while (iVar1 != 0);
    if (local_40 == pIter->iCol) {
      iVar2 = (*pIter->pApi->xPhraseSize)(pIter->pFts,local_3c);
      iVar3 = iVar2 + iVar3 + -1;
      if (pIter->iStart < 0) {
        pIter->iStart = local_44;
      }
      else {
        if (pIter->iEnd < local_44) {
LAB_001d4a3d:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return iVar4;
        }
        if (iVar3 <= pIter->iEnd) goto LAB_001d4a32;
      }
      pIter->iEnd = iVar3;
    }
LAB_001d4a32:
    pIter->iInst = pIter->iInst + 1;
  } while( true );
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}